

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  char cVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong unaff_RBX;
  ulong uVar15;
  NodeRef *pNVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi;
  undefined1 auVar42 [16];
  vint4 bi_1;
  undefined1 auVar43 [16];
  vint4 bi_2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai_2;
  undefined1 auVar46 [16];
  vint4 ai_1;
  undefined1 auVar47 [16];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 1.0000004)));
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 1.0000004)));
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  pNVar17 = stack + 1;
  do {
    pNVar16 = pNVar17;
    if (pNVar16 == stack) break;
    pNVar17 = pNVar16 + -1;
    sVar20 = pNVar16[-1].ptr;
    do {
      if ((sVar20 & 0xf) == 0) {
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(sVar20 + 0x20 + uVar18),auVar52);
        auVar33 = vmulps_avx512vl(auVar25,auVar33);
        auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar20 + 0x20 + uVar21),auVar23);
        auVar34 = vmulps_avx512vl(auVar26,auVar34);
        auVar33 = vmaxps_avx(auVar33,auVar34);
        auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar20 + 0x20 + uVar15),auVar24);
        auVar35 = vmulps_avx512vl(auVar27,auVar34);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(sVar20 + 0x20 + (uVar18 ^ 0x10)),auVar52);
        auVar34 = vmulps_avx512vl(auVar28,auVar34);
        auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar20 + 0x20 + (uVar21 ^ 0x10)),auVar23);
        auVar36 = vmulps_avx512vl(auVar29,auVar36);
        auVar34 = vminps_avx(auVar34,auVar36);
        auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(sVar20 + 0x20 + (uVar15 ^ 0x10)),auVar24);
        auVar36 = vmulps_avx512vl(auVar30,auVar36);
        auVar35 = vmaxps_avx512vl(auVar35,auVar31);
        auVar33 = vmaxps_avx(auVar33,auVar35);
        auVar35 = vminps_avx512vl(auVar36,auVar32);
        auVar34 = vminps_avx(auVar34,auVar35);
        uVar8 = vcmpps_avx512vl(auVar33,auVar34,2);
        bVar22 = (byte)uVar8;
LAB_007852fa:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar22);
        bVar7 = true;
      }
      else {
        if ((int)(sVar20 & 0xf) == 2) {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          auVar33 = *(undefined1 (*) [16])(uVar19 + 0x80);
          auVar36._0_4_ = fVar3 * auVar33._0_4_;
          auVar36._4_4_ = fVar3 * auVar33._4_4_;
          auVar36._8_4_ = fVar3 * auVar33._8_4_;
          auVar36._12_4_ = fVar3 * auVar33._12_4_;
          auVar34 = *(undefined1 (*) [16])(uVar19 + 0x90);
          auVar39._0_4_ = fVar3 * auVar34._0_4_;
          auVar39._4_4_ = fVar3 * auVar34._4_4_;
          auVar39._8_4_ = fVar3 * auVar34._8_4_;
          auVar39._12_4_ = fVar3 * auVar34._12_4_;
          auVar35 = *(undefined1 (*) [16])(uVar19 + 0xa0);
          auVar44._0_4_ = fVar3 * auVar35._0_4_;
          auVar44._4_4_ = fVar3 * auVar35._4_4_;
          auVar44._8_4_ = fVar3 * auVar35._8_4_;
          auVar44._12_4_ = fVar3 * auVar35._12_4_;
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          auVar36 = vfmadd231ps_fma(auVar36,auVar40,*(undefined1 (*) [16])(uVar19 + 0x50));
          auVar39 = vfmadd231ps_fma(auVar39,auVar40,*(undefined1 (*) [16])(uVar19 + 0x60));
          auVar40 = vfmadd231ps_fma(auVar44,auVar40,*(undefined1 (*) [16])(uVar19 + 0x70));
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar41 = vfmadd231ps_fma(auVar36,auVar10,*(undefined1 (*) [16])(uVar19 + 0x20));
          auVar39 = vfmadd231ps_fma(auVar39,auVar10,*(undefined1 (*) [16])(uVar19 + 0x30));
          auVar40 = vfmadd231ps_fma(auVar40,auVar10,*(undefined1 (*) [16])(uVar19 + 0x40));
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          auVar36 = vandps_avx(auVar49,auVar41);
          auVar51._8_4_ = 0x219392ef;
          auVar51._0_8_ = 0x219392ef219392ef;
          auVar51._12_4_ = 0x219392ef;
          uVar12 = vcmpps_avx512vl(auVar36,auVar51,1);
          bVar7 = (bool)((byte)uVar12 & 1);
          auVar37._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar41._0_4_;
          bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar41._4_4_;
          bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar41._8_4_;
          bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar41._12_4_;
          auVar36 = vandps_avx(auVar49,auVar39);
          uVar12 = vcmpps_avx512vl(auVar36,auVar51,1);
          bVar7 = (bool)((byte)uVar12 & 1);
          auVar41._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar39._12_4_;
          auVar36 = vandps_avx(auVar49,auVar40);
          uVar12 = vcmpps_avx512vl(auVar36,auVar51,1);
          bVar7 = (bool)((byte)uVar12 & 1);
          auVar38._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._0_4_;
          bVar7 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._4_4_;
          bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._8_4_;
          bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar40._12_4_;
          auVar39 = vrcp14ps_avx512vl(auVar37);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = &DAT_3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar36 = vfnmadd213ps_fma(auVar37,auVar39,auVar50);
          auVar36 = vfmadd132ps_fma(auVar36,auVar39,auVar39);
          auVar40 = vrcp14ps_avx512vl(auVar41);
          auVar39 = vfnmadd213ps_fma(auVar41,auVar40,auVar50);
          auVar39 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
          auVar41 = vrcp14ps_avx512vl(auVar38);
          auVar40 = vfnmadd213ps_fma(auVar38,auVar41,auVar50);
          auVar40 = vfmadd132ps_fma(auVar40,auVar41,auVar41);
          auVar33 = vfmadd213ps_avx512vl(auVar33,auVar24,*(undefined1 (*) [16])(uVar19 + 0xb0));
          auVar34 = vfmadd213ps_avx512vl(auVar34,auVar24,*(undefined1 (*) [16])(uVar19 + 0xc0));
          auVar35 = vfmadd213ps_avx512vl(auVar35,auVar24,*(undefined1 (*) [16])(uVar19 + 0xd0));
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar23,*(undefined1 (*) [16])(uVar19 + 0x50));
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar23,*(undefined1 (*) [16])(uVar19 + 0x60));
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar23,*(undefined1 (*) [16])(uVar19 + 0x70));
          auVar33 = vfmadd231ps_fma(auVar33,auVar52,*(undefined1 (*) [16])(uVar19 + 0x20));
          auVar48._0_4_ = -auVar36._0_4_ * auVar33._0_4_;
          auVar48._4_4_ = -auVar36._4_4_ * auVar33._4_4_;
          auVar48._8_4_ = -auVar36._8_4_ * auVar33._8_4_;
          auVar48._12_4_ = -auVar36._12_4_ * auVar33._12_4_;
          auVar33 = vfmadd231ps_fma(auVar34,auVar52,*(undefined1 (*) [16])(uVar19 + 0x30));
          auVar47._0_4_ = -auVar39._0_4_ * auVar33._0_4_;
          auVar47._4_4_ = -auVar39._4_4_ * auVar33._4_4_;
          auVar47._8_4_ = -auVar39._8_4_ * auVar33._8_4_;
          auVar47._12_4_ = -auVar39._12_4_ * auVar33._12_4_;
          auVar33 = vfmadd231ps_fma(auVar35,auVar52,*(undefined1 (*) [16])(uVar19 + 0x40));
          auVar46._0_4_ = -auVar40._0_4_ * auVar33._0_4_;
          auVar46._4_4_ = -auVar40._4_4_ * auVar33._4_4_;
          auVar46._8_4_ = -auVar40._8_4_ * auVar33._8_4_;
          auVar46._12_4_ = -auVar40._12_4_ * auVar33._12_4_;
          auVar42._0_4_ = auVar36._0_4_ + auVar48._0_4_;
          auVar42._4_4_ = auVar36._4_4_ + auVar48._4_4_;
          auVar42._8_4_ = auVar36._8_4_ + auVar48._8_4_;
          auVar42._12_4_ = auVar36._12_4_ + auVar48._12_4_;
          auVar43._0_4_ = auVar39._0_4_ + auVar47._0_4_;
          auVar43._4_4_ = auVar39._4_4_ + auVar47._4_4_;
          auVar43._8_4_ = auVar39._8_4_ + auVar47._8_4_;
          auVar43._12_4_ = auVar39._12_4_ + auVar47._12_4_;
          auVar45._0_4_ = auVar40._0_4_ + auVar46._0_4_;
          auVar45._4_4_ = auVar40._4_4_ + auVar46._4_4_;
          auVar45._8_4_ = auVar40._8_4_ + auVar46._8_4_;
          auVar45._12_4_ = auVar40._12_4_ + auVar46._12_4_;
          auVar39 = vpminsd_avx(auVar48,auVar42);
          auVar33 = vpminsd_avx(auVar47,auVar43);
          auVar34 = vpminsd_avx(auVar46,auVar45);
          auVar33 = vmaxps_avx(auVar33,auVar34);
          auVar35 = vpmaxsd_avx(auVar48,auVar42);
          auVar34 = vpmaxsd_avx(auVar47,auVar43);
          auVar36 = vpmaxsd_avx(auVar46,auVar45);
          auVar34 = vminps_avx(auVar34,auVar36);
          auVar36 = vmaxps_avx512vl(auVar31,auVar39);
          auVar33 = vmaxps_avx(auVar36,auVar33);
          auVar35 = vminps_avx512vl(auVar32,auVar35);
          auVar34 = vminps_avx(auVar35,auVar34);
          auVar35._8_4_ = 0x3f7ffffa;
          auVar35._0_8_ = 0x3f7ffffa3f7ffffa;
          auVar35._12_4_ = 0x3f7ffffa;
          auVar35 = vmulps_avx512vl(auVar33,auVar35);
          auVar33._8_4_ = 0x3f800003;
          auVar33._0_8_ = 0x3f8000033f800003;
          auVar33._12_4_ = 0x3f800003;
          auVar33 = vmulps_avx512vl(auVar34,auVar33);
          uVar8 = vcmpps_avx512vl(auVar35,auVar33,2);
          bVar22 = (byte)uVar8;
          goto LAB_007852fa;
        }
        bVar7 = false;
      }
      if (bVar7) {
        if (unaff_RBX == 0) {
          uVar13 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar14 = 0;
          for (uVar12 = unaff_RBX; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar13 = 0;
          for (uVar12 = unaff_RBX - 1 & unaff_RBX; sVar20 = *(size_t *)(uVar19 + lVar14 * 8),
              uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
            pNVar17->ptr = sVar20;
            pNVar17 = pNVar17 + 1;
            lVar14 = 0;
            for (uVar9 = uVar12; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
          }
        }
      }
      else {
        uVar13 = 6;
      }
    } while (uVar13 == 0);
    if (uVar13 == 6) {
      cVar11 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar20 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar13 = 0;
      if (cVar11 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar13 = 1;
      }
    }
  } while ((uVar13 & 3) == 0);
  return pNVar16 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }